

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int ev_handler(mg_connection *conn,mg_event ev)

{
  int iVar1;
  int exec_result;
  mg_event ev_local;
  mg_connection *conn_local;
  
  if (ev == MG_AUTH) {
    conn_local._4_4_ = 2;
  }
  else if (ev == MG_REQUEST) {
    fprintf(_stdout,"Processing %s\n",conn->uri);
    iVar1 = exec_route(conn->uri,conn);
    if (iVar1 == 0x194) {
      conn_local._4_4_ = 0;
    }
    else if (iVar1 == 0) {
      conn_local._4_4_ = 0;
    }
    else {
      conn_local._4_4_ = 1;
    }
  }
  else {
    conn_local._4_4_ = 0;
  }
  return conn_local._4_4_;
}

Assistant:

static int ev_handler(struct mg_connection *conn, enum mg_event ev) {
	int exec_result;

    switch (ev) {
        case MG_AUTH:
            return MG_MORE;
        case MG_REQUEST:
			fprintf(stdout, "Processing %s\n", conn->uri);
            
			exec_result = exec_route(conn->uri, conn);

			if (exec_result == 404) {
				return MG_FALSE;
			}
			else if (!exec_result) {
				return MG_FALSE;
			}

            return MG_TRUE;
        default:
            return MG_FALSE;
    }
}